

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STObject.cpp
# Opt level: O3

void __thiscall jbcoin::STObject::makeFieldAbsent(STObject *this,SField *field)

{
  STBase *pSVar1;
  int iVar2;
  int iVar3;
  _func_int **pp_Var4;
  STVar local_78;
  
  iVar2 = getFieldIndex(this,field);
  if (iVar2 == -1) {
    Throw<std::runtime_error,char_const(&)[16]>((char (*) [16])"Field not found");
  }
  pSVar1 = (this->v_).
           super__Vector_base<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>._M_impl
           .super__Vector_impl_data._M_start[iVar2].p_;
  iVar3 = (*pSVar1->_vptr_STBase[4])(pSVar1);
  if (iVar3 != 0) {
    local_78.d_._8_8_ = pSVar1->fName;
    local_78.d_._0_8_ = &PTR__STBase_002d3040;
    local_78.p_ = (STBase *)&local_78;
    detail::STVar::operator=
              ((this->v_).
               super__Vector_base<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>.
               _M_impl.super__Vector_impl_data._M_start + iVar2,&local_78);
    if (local_78.p_ == (STBase *)&local_78) {
      pp_Var4 = (local_78.p_)->_vptr_STBase;
    }
    else {
      if (local_78.p_ == (STBase *)0x0) {
        return;
      }
      pp_Var4 = (local_78.p_)->_vptr_STBase + 1;
    }
    (**pp_Var4)();
  }
  return;
}

Assistant:

void STObject::makeFieldAbsent (SField const& field)
{
    int index = getFieldIndex (field);

    if (index == -1)
        Throw<std::runtime_error> ("Field not found");

    const STBase& f = peekAtIndex (index);

    if (f.getSType () == STI_NOTPRESENT)
        return;
    v_[index] = detail::STVar(
        detail::nonPresentObject, f.getFName());
}